

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_get.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> __thiscall
duckdb::CreateTableFilterSet
          (duckdb *this,TableFilterSet *table_filters,vector<duckdb::ColumnIndex,_true> *column_ids)

{
  idx_t iVar1;
  const_reference pvVar2;
  map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  *this_00;
  __uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_> *this_01;
  _Base_ptr p_Var3;
  InternalException *this_02;
  ulong __n;
  allocator local_61;
  __uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> local_60;
  optional_idx column_index;
  string local_50;
  
  local_60._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl =
       (tuple<duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>)
       (tuple<duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>)this;
  make_uniq<duckdb::TableFilterSet>();
  p_Var3 = (table_filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(table_filters->filters)._M_t._M_impl.super__Rb_tree_header) {
      return (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
             (_Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
              )local_60._M_t.
               super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
               .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
    }
    column_index.index = 0xffffffffffffffff;
    for (__n = 0; __n < (ulong)((long)(column_ids->
                                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ).
                                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(column_ids->
                                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ).
                                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1
        ) {
      iVar1 = *(idx_t *)(p_Var3 + 1);
      pvVar2 = vector<duckdb::ColumnIndex,_true>::get<true>(column_ids,__n);
      if (iVar1 == pvVar2->index) {
        optional_idx::optional_idx((optional_idx *)&local_50,__n);
        column_index.index = (idx_t)local_50._M_dataplus._M_p;
        break;
      }
    }
    if (column_index.index == 0xffffffffffffffff) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Could not find column index for table filter",&local_61);
      InternalException::InternalException(this_02,&local_50);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = &unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
               ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                             *)local_60._M_t.
                               super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
                               .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl)
               ->filters;
    local_50._M_dataplus._M_p = (pointer)optional_idx::GetIndex(&column_index);
    this_01 = (__uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_> *)
              ::std::
              map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
              ::operator[](this_00,(key_type *)&local_50);
    ::std::__uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>::
    operator=(this_01,(__uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                       *)&p_Var3[1]._M_parent);
    p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

unique_ptr<TableFilterSet> CreateTableFilterSet(TableFilterSet &table_filters, const vector<ColumnIndex> &column_ids) {
	// create the table filter map
	auto table_filter_set = make_uniq<TableFilterSet>();
	for (auto &table_filter : table_filters.filters) {
		// find the relative column index from the absolute column index into the table
		optional_idx column_index;
		for (idx_t i = 0; i < column_ids.size(); i++) {
			if (table_filter.first == column_ids[i].GetPrimaryIndex()) {
				column_index = i;
				break;
			}
		}
		if (!column_index.IsValid()) {
			throw InternalException("Could not find column index for table filter");
		}
		table_filter_set->filters[column_index.GetIndex()] = std::move(table_filter.second);
	}
	return table_filter_set;
}